

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void ge_equals_ge(secp256k1_ge *a,secp256k1_ge *b)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x50) != *(int *)(in_RSI + 0x50)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xe9b,"test condition failed: a->infinity == b->infinity");
    abort();
  }
  if (*(int *)(in_RDI + 0x50) == 0) {
    iVar1 = secp256k1_fe_equal_var(&a->x,&b->x);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xe9f,"test condition failed: secp256k1_fe_equal_var(&a->x, &b->x)");
      abort();
    }
    iVar1 = secp256k1_fe_equal_var(&a->x,&b->x);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xea0,"test condition failed: secp256k1_fe_equal_var(&a->y, &b->y)");
      abort();
    }
  }
  return;
}

Assistant:

static void ge_equals_ge(const secp256k1_ge *a, const secp256k1_ge *b) {
    CHECK(a->infinity == b->infinity);
    if (a->infinity) {
        return;
    }
    CHECK(secp256k1_fe_equal_var(&a->x, &b->x));
    CHECK(secp256k1_fe_equal_var(&a->y, &b->y));
}